

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CALLBACK::Convert(_Type_CALLBACK *this,Variable *object,Type *type)

{
  bool bVar1;
  bool *pbVar2;
  Number *this_00;
  String *this_01;
  Object *pOVar3;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  Variable VVar5;
  string local_218 [32];
  String local_1f8;
  stringstream local_1d8 [8];
  stringstream ss;
  undefined1 local_1c8 [383];
  byte local_49;
  Number local_48;
  undefined1 local_3d;
  undefined1 local_29;
  Type *local_28;
  Type *type_local;
  Variable *object_local;
  _Type_CALLBACK *this_local;
  Variable *result;
  uint *puVar4;
  
  local_28 = in_RCX;
  type_local = type;
  object_local = object;
  this_local = this;
  bVar1 = Type::operator==(in_RCX,(Type *)_type_boolean);
  if (bVar1) {
    local_29 = 0;
    pOVar3 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->((Variable *)this);
    pbVar2 = Object::GetData<bool>(pOVar3);
    *pbVar2 = true;
    puVar4 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(local_28,(Type *)_type_number);
    if (bVar1) {
      local_3d = 0;
      pOVar3 = Variable::operator->((Variable *)type_local);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->((Variable *)type_local);
      Number::Number(&local_48,pOVar3->ID);
      pOVar3 = Variable::operator->((Variable *)this);
      this_00 = Object::GetData<LiteScript::Number>(pOVar3);
      Number::operator=(this_00,&local_48);
      puVar4 = extraout_RDX_00;
    }
    else {
      bVar1 = Type::operator==(local_28,(Type *)_type_string);
      if (bVar1) {
        local_49 = 0;
        pOVar3 = Variable::operator->((Variable *)type_local);
        Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        std::__cxx11::stringstream::stringstream(local_1d8);
        pOVar3 = Variable::operator->((Variable *)type_local);
        std::ostream::operator<<(local_1c8,pOVar3->ID);
        std::__cxx11::stringstream::str();
        String::String(&local_1f8,local_218);
        pOVar3 = Variable::operator->((Variable *)this);
        this_01 = Object::GetData<LiteScript::String>(pOVar3);
        String::operator=(this_01,&local_1f8);
        String::~String(&local_1f8);
        std::__cxx11::string::~string((string *)local_218);
        local_49 = 1;
        std::__cxx11::stringstream::~stringstream(local_1d8);
        puVar4 = extraout_RDX_01;
        if ((local_49 & 1) == 0) {
          Variable::~Variable((Variable *)this);
          puVar4 = extraout_RDX_02;
        }
      }
      else {
        pOVar3 = Variable::operator->((Variable *)type_local);
        VVar5 = Memory::Create((Memory *)this,(Type *)pOVar3->memory);
        puVar4 = VVar5.nb_ref;
      }
    }
  }
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::Convert(const Variable &object, const Type &type) const {
    if (type == Type::BOOLEAN) {
        Variable result = object->memory.Create(Type::BOOLEAN);
        result->GetData<bool>() = true;
        return result;
    }
    else if (type == Type::NUMBER) {
        Variable result = object->memory.Create(Type::NUMBER);
        result->GetData<Number>() = Number((int)object->ID);
        return result;
    }
    else if (type == Type::STRING) {
        Variable result = object->memory.Create(Type::STRING);
        std::stringstream ss;
        ss << object->ID;
        result->GetData<String>() = String(ss.str());
        return result;
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}